

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

FreeFormatParserReturnCode __thiscall
free_format_parser::HMpsFF::loadProblem
          (HMpsFF *this,HighsLogOptions *log_options,string *filename,HighsModel *model)

{
  string *this_00;
  pointer pHVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer ppVar4;
  pointer pdVar5;
  pointer pHVar6;
  FreeFormatParserReturnCode FVar7;
  HighsInt HVar8;
  pointer ppVar9;
  char *format;
  long lVar10;
  string local_48;
  
  this->warning_issued_ = false;
  FVar7 = parse(this,log_options,filename);
  if (FVar7 != kSuccess) {
    return FVar7;
  }
  if ((this->qrows_entries).
      super__Vector_base<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->qrows_entries).
      super__Vector_base<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((this->sos_entries).
        super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->sos_entries).
        super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->cone_entries).
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->cone_entries).
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (this->has_duplicate_row_name_ == true) {
          this->warning_issued_ = true;
          highsLogUser(log_options,kWarning,
                       "Linear constraints %d and %d have the same name \"%s\"\n",
                       (ulong)(uint)this->duplicate_row_name_index0_,
                       (ulong)(uint)this->duplicate_row_name_index1_,
                       (this->duplicate_row_name_)._M_dataplus._M_p);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->row_names);
        }
        if (this->has_duplicate_col_name_ == true) {
          this->warning_issued_ = true;
          highsLogUser(log_options,kWarning,"Variables %d and %d have the same name \"%s\"\n",
                       (ulong)(uint)this->duplicate_col_name_index0_,
                       (ulong)(uint)this->duplicate_col_name_index1_,
                       (this->duplicate_col_name_)._M_dataplus._M_p);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->col_names);
        }
        local_48._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  (&this->col_cost,(long)this->num_col,(value_type_conflict1 *)&local_48);
        ppVar4 = (this->coeffobj).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pdVar5 = (this->col_cost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (ppVar9 = (this->coeffobj).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar4;
            ppVar9 = ppVar9 + 1) {
          pdVar5[ppVar9->first] = ppVar9->second;
        }
        HVar8 = fillMatrix(this,log_options);
        if (HVar8 != 0) {
          return kParserError;
        }
        fillHessian(this,log_options);
        uVar2 = this->num_row;
        uVar3 = this->num_col;
        (model->lp_).num_col_ = uVar3;
        (model->lp_).num_row_ = uVar2;
        (model->lp_).sense_ = this->obj_sense;
        (model->lp_).offset_ = this->obj_offset;
        (model->lp_).a_matrix_.format_ = kColwise;
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&(model->lp_).a_matrix_.start_,&this->a_start);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&(model->lp_).a_matrix_.index_,&this->a_index);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).a_matrix_.value_,&this->a_value);
        if ((model->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (model->lp_).a_matrix_.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          HighsSparseMatrix::clear(&(model->lp_).a_matrix_);
        }
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).col_cost_,&this->col_cost);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).col_lower_,&this->col_lower);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).col_upper_,&this->col_upper);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).row_lower_,&this->row_lower);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->lp_).row_upper_,&this->row_upper);
        this_00 = &(model->lp_).objective_name_;
        std::__cxx11::string::_M_assign((string *)this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&(model->lp_).row_names_,&this->row_names);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&(model->lp_).col_names_,&this->col_names);
        pHVar6 = (this->col_integrality).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = 0;
        do {
          if ((long)(this->col_integrality).
                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pHVar6 == lVar10) goto LAB_00222386;
          pHVar1 = pHVar6 + lVar10;
          lVar10 = lVar10 + 1;
        } while (*pHVar1 == kContinuous);
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_move_assign
                  (&(model->lp_).integrality_,&this->col_integrality);
LAB_00222386:
        (model->hessian_).dim_ = this->q_dim;
        (model->hessian_).format_ = kTriangular;
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&(model->hessian_).start_,&this->q_start);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&(model->hessian_).index_,&this->q_index);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  (&(model->hessian_).value_,&this->q_value);
        if ((model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (model->hessian_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          HighsHessian::clear(&model->hessian_);
        }
        findModelObjectiveName_abi_cxx11_(&local_48,&model->lp_,&model->hessian_);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        (model->lp_).cost_row_location_ = this->cost_row_location;
        return kSuccess;
      }
      format = "Cones not supported by HiGHS\n";
    }
    else {
      format = "SOS not supported by HiGHS\n";
    }
  }
  else {
    format = "Quadratic rows not supported by HiGHS\n";
  }
  highsLogUser(log_options,kError,format);
  return kParserError;
}

Assistant:

FreeFormatParserReturnCode HMpsFF::loadProblem(
    const HighsLogOptions& log_options, const std::string filename,
    HighsModel& model) {
  // Keep track of any warnings that are issued so that
  // Highs::readModel can return HighsStatus::kWarning
  warning_issued_ = false;
  HighsLp& lp = model.lp_;
  HighsHessian& hessian = model.hessian_;
  FreeFormatParserReturnCode result = parse(log_options, filename);
  if (result != FreeFormatParserReturnCode::kSuccess) return result;

  if (!qrows_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Quadratic rows not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  if (!sos_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "SOS not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  if (!cone_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Cones not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  // Duplicate row and column names in MPS files occur if the same row
  // name appears twice in the ROWS section, or if a column name
  // reoccurs in the COLUMNS section after another column has been
  // defined. They are anomalies, but are only handled by a warning in
  // some solvers. Hence, rather than fail, HiGHS does the same.
  //
  // If there are duplicate row (column) names, then they are treated
  // as distinct rows (columns), so the row (column) names array is
  // not valid. Report this for the first instance, and clear the row
  // (column) names array.
  //
  // Note that rowname2idx and colname2idx will return the index
  // corresponding to the first occurrence of the name, so values for
  // rows in the COLUMNS, RHS and RANGES sections, and columns in the
  // BOUNDS and other sections can only be defined for the first
  // occurrence
  if (has_duplicate_row_name_) {
    warning_issued_ = true;
    highsLogUser(log_options, HighsLogType::kWarning,
                 "Linear constraints %d and %d have the same name \"%s\"\n",
                 (int)duplicate_row_name_index0_,
                 (int)duplicate_row_name_index1_, duplicate_row_name_.c_str());
    row_names.clear();
  }
  if (has_duplicate_col_name_) {
    warning_issued_ = true;
    highsLogUser(log_options, HighsLogType::kWarning,
                 "Variables %d and %d have the same name \"%s\"\n",
                 (int)duplicate_col_name_index0_,
                 (int)duplicate_col_name_index1_, duplicate_col_name_.c_str());
    col_names.clear();
  }
  col_cost.assign(num_col, 0);
  for (auto i : coeffobj) col_cost[i.first] = i.second;
  HighsInt status = fillMatrix(log_options);
  if (status) return FreeFormatParserReturnCode::kParserError;
  status = fillHessian(log_options);
  if (status) return FreeFormatParserReturnCode::kParserError;

  lp.num_row_ = num_row;
  lp.num_col_ = num_col;

  lp.sense_ = obj_sense;
  lp.offset_ = obj_offset;

  lp.a_matrix_.format_ = MatrixFormat::kColwise;
  lp.a_matrix_.start_ = std::move(a_start);
  lp.a_matrix_.index_ = std::move(a_index);
  lp.a_matrix_.value_ = std::move(a_value);
  // a must have at least start_[0]=0 for the fictitious column
  // 0
  if (lp.a_matrix_.start_.size() == 0) lp.a_matrix_.clear();
  lp.col_cost_ = std::move(col_cost);
  lp.col_lower_ = std::move(col_lower);
  lp.col_upper_ = std::move(col_upper);
  lp.row_lower_ = std::move(row_lower);
  lp.row_upper_ = std::move(row_upper);

  lp.objective_name_ = objective_name;
  lp.row_names_ = std::move(row_names);
  lp.col_names_ = std::move(col_names);

  // Only set up lp.integrality_ if non-continuous
  bool is_mip = false;
  for (size_t iCol = 0; iCol < col_integrality.size(); iCol++) {
    if (col_integrality[iCol] != HighsVarType::kContinuous) {
      is_mip = true;
      break;
    }
  }
  if (is_mip) lp.integrality_ = std::move(col_integrality);

  hessian.dim_ = q_dim;
  hessian.format_ = HessianFormat::kTriangular;
  hessian.start_ = std::move(q_start);
  hessian.index_ = std::move(q_index);
  hessian.value_ = std::move(q_value);
  // hessian must have at least start_[0]=0 for the fictitious column
  // 0
  if (hessian.start_.size() == 0) hessian.clear();

  // Set the objective name, creating one if necessary
  lp.objective_name_ = findModelObjectiveName(&lp, &hessian);
  lp.cost_row_location_ = cost_row_location;

  return FreeFormatParserReturnCode::kSuccess;
}